

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_aa32_st_i64(DisasContext_conflict1 *s,TCGv_i64 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 ret;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  addr = gen_aa32_addr(s,a32,opc);
  if (((s->uc->mode & UC_MODE_ARMBE8) == UC_MODE_ARM) || (s->sctlr_b == 0)) {
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,val,addr,(ulong)(uint)index,opc);
  }
  else {
    ret = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_rotri_i64_aarch64(tcg_ctx,ret,val,0x20);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,ret,addr,(ulong)(uint)index,opc);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_aa32_st_i64(DisasContext *s, TCGv_i64 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr = gen_aa32_addr(s, a32, opc);

    /* Not needed for user-mode BE32, where we use MO_BE instead.  */
    // Unicorn: By default UC_MODE_BIG_MODE is BE32 mode, which in fact qemu-usermode.
    //          Thus, we only do this in BE8 (qemu system) mode.
    if ( (s->uc->mode & UC_MODE_ARMBE8) && s->sctlr_b) {
        TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_rotri_i64(tcg_ctx, tmp, val, 32);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, addr, index, opc);
        tcg_temp_free_i64(tcg_ctx, tmp);
    } else {
        tcg_gen_qemu_st_i64(tcg_ctx, val, addr, index, opc);
    }
    tcg_temp_free(tcg_ctx, addr);
}